

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcFragDepthTests.cpp
# Opt level: O1

void __thiscall deqp::FragDepthCompareCase::~FragDepthCompareCase(FragDepthCompareCase *this)

{
  ~FragDepthCompareCase(this);
  operator_delete(this,0xb0);
  return;
}

Assistant:

FragDepthCompareCase::~FragDepthCompareCase(void)
{
}